

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::InstanceArray::boundSegment
          (BBox3fa *__return_storage_ptr__,InstanceArray *this,size_t i,size_t itime,BBox3fa *obbox0
          ,BBox3fa *obbox1,BBox3fa *bbox0,BBox3fa *bbox1,float tmin,float tmax)

{
  float *pfVar1;
  undefined1 (*pauVar2) [16];
  undefined8 uVar3;
  RTCFormat RVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  RawBufferView *pRVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  Vec3fa VVar12;
  Vec3fa VVar13;
  undefined4 uVar14;
  int ii;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int dim;
  ulong uVar21;
  BBox3fa *delta;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float in_XMM0_Db;
  float fVar26;
  uint uVar27;
  float in_XMM0_Dc;
  float fVar28;
  float in_XMM0_Dd;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [12];
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  float fVar34;
  undefined1 in_XMM5 [16];
  float in_XMM6_Da;
  float fVar35;
  float in_XMM6_Db;
  float fVar36;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar37;
  float fVar39;
  undefined1 in_XMM7 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  float fVar43;
  undefined1 in_XMM8 [16];
  undefined1 auVar42 [16];
  float fVar44;
  float in_XMM9_Da;
  float fVar45;
  float in_XMM9_Db;
  float fVar46;
  float in_XMM9_Dc;
  float fVar47;
  float in_XMM9_Dd;
  float fVar48;
  float fVar49;
  undefined1 auVar51 [12];
  float fVar50;
  undefined1 in_XMM10 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float in_XMM11_Da;
  float fVar54;
  float fVar55;
  float in_XMM11_Db;
  float fVar56;
  float in_XMM11_Dc;
  float fVar57;
  float in_XMM11_Dd;
  undefined1 auVar59 [12];
  float fVar58;
  uint uVar60;
  undefined1 in_XMM12 [16];
  float in_XMM13_Da;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float in_XMM13_Db;
  float fVar65;
  float fVar66;
  float in_XMM13_Dc;
  float fVar67;
  float fVar68;
  float in_XMM13_Dd;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  float in_XMM14_Dd;
  float in_XMM15_Da;
  float fVar69;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  undefined1 local_698 [8];
  float fStack_690;
  float fStack_68c;
  undefined1 local_688 [8];
  float fStack_680;
  float fStack_67c;
  undefined1 local_658 [8];
  float fStack_650;
  float fStack_64c;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float cosTheta;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  Vec3fa pt;
  undefined1 local_598 [8];
  undefined4 uStack_590;
  float fStack_58c;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  float local_568;
  float fStack_564;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  Interval1f interval;
  Vec3fa nom;
  undefined1 local_528 [8];
  undefined4 uStack_520;
  float fStack_51c;
  undefined1 local_518 [16];
  undefined1 local_508 [112];
  float x;
  Vec3fa pt_1;
  Vec3fa p1;
  Vec3fa p0;
  BBox3fa bt_1;
  uint local_3a8;
  MotionDerivative motionDerivative;
  Vec3fa denom;
  BBox3fa bt;
  
  if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
    pRVar7 = (this->l2w_buf).items;
    pRVar5 = pRVar7 + itime;
    RVar4 = pRVar7[itime].format;
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      nom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x10);
      nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar19);
      nom.field_0.m128[2] = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x20);
      nom.field_0.m128[3] = 0.0;
      local_528._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
      local_528._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
      uStack_520 = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      fStack_51c = 0.0;
      local_518._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      local_518._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
      local_518._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x28);
      local_518._12_4_ = 0;
      local_508._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
      local_508._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      local_508._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x2c);
      local_508._12_4_ = 0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      nom.field_0.m128[1] = (float)(int)*(undefined8 *)(pcVar6 + lVar19 + 4);
      nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar19);
      nom.field_0.m128[2] = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
      nom.field_0.m128[3] = 0.0;
      local_528._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
      local_528._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      uStack_520 = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
      fStack_51c = 0.0;
      local_518._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      local_518._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      local_518._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      local_518._12_4_ = 0;
      local_508._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x28);
      local_508._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      local_508._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x28) >> 0x20);
      local_508._12_4_ = 0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      local_528._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
      local_518._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
      local_528._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      local_518._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
      local_518._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x10);
      nom.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x34);
      nom.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar19);
      nom.field_0.m128[2] = *(float *)(pcVar6 + lVar19 + 0x38);
      uStack_520 = *(undefined4 *)(pcVar6 + lVar19 + 0x3c);
      local_508._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
      local_508._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      local_508._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x20);
      auVar38._0_4_ = *(float *)(pcVar6 + lVar19 + 0x24);
      fVar22 = *(float *)(pcVar6 + lVar19 + 0x28);
      fVar30 = *(float *)(pcVar6 + lVar19 + 0x2c);
      fVar37 = *(float *)(pcVar6 + lVar19 + 0x30);
      fVar54 = fVar37 * fVar37 + fVar30 * fVar30 + auVar38._0_4_ * auVar38._0_4_ + fVar22 * fVar22;
      auVar52 = rsqrtss(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
      fVar48 = auVar52._0_4_;
      fVar48 = fVar48 * fVar48 * fVar54 * -0.5 * fVar48 + fVar48 * 1.5;
      nom.field_0.m128[3] = fVar22 * fVar48;
      fStack_51c = fVar30 * fVar48;
      local_518._12_4_ = fVar48 * fVar37;
      local_508._12_4_ = auVar38._0_4_ * fVar48;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      nom.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar6 + lVar19);
      _local_528 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                   *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                    &((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar19 + 0x10))->field_1;
      local_518 = *(undefined1 (*) [16])
                   &((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar19 + 0x20))->field_1;
      local_508._0_16_ =
           *(undefined1 (*) [16])
            &((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar19 + 0x30))->field_1;
    }
    RVar4 = pRVar5[1].format;
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar19 = i * pRVar5[1].stride;
      pt.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x10);
      pt.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar19);
      pt.field_0.m128[2] = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x20);
      pt.field_0.m128[3] = 0.0;
      local_598._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
      local_598._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
      uStack_590 = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      fStack_58c = 0.0;
      local_588._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      local_588._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
      local_588._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x28);
      local_588._12_4_ = 0;
      local_578._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
      local_578._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      local_578._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x2c);
      local_578._12_4_ = 0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar19 = i * pRVar5[1].stride;
      pt.field_0.m128[1] = (float)(int)*(undefined8 *)(pcVar6 + lVar19 + 4);
      pt.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar19);
      pt.field_0.m128[2] = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
      pt.field_0.m128[3] = 0.0;
      local_598._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
      local_598._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      uStack_590 = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
      fStack_58c = 0.0;
      local_588._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      local_588._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      local_588._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      local_588._12_4_ = 0;
      local_578._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x28);
      local_578._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      local_578._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x28) >> 0x20);
      local_578._12_4_ = 0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar19 = i * pRVar5[1].stride;
      local_598._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
      local_588._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
      local_598._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      local_588._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
      local_588._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x10);
      pt.field_0.m128[1] = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x34);
      pt.field_0.m128[0] = (float)*(undefined4 *)(pcVar6 + lVar19);
      pt.field_0.m128[2] = *(float *)(pcVar6 + lVar19 + 0x38);
      uStack_590 = *(undefined4 *)(pcVar6 + lVar19 + 0x3c);
      local_578._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
      local_578._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      local_578._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x20);
      auVar38._0_4_ = *(float *)(pcVar6 + lVar19 + 0x24);
      fVar22 = *(float *)(pcVar6 + lVar19 + 0x28);
      fVar30 = *(float *)(pcVar6 + lVar19 + 0x2c);
      fVar37 = *(float *)(pcVar6 + lVar19 + 0x30);
      fVar54 = fVar37 * fVar37 + fVar30 * fVar30 + auVar38._0_4_ * auVar38._0_4_ + fVar22 * fVar22;
      auVar52 = rsqrtss(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
      fVar48 = auVar52._0_4_;
      fVar48 = fVar48 * fVar48 * fVar54 * -0.5 * fVar48 + fVar48 * 1.5;
      pt.field_0.m128[3] = fVar22 * fVar48;
      fStack_58c = fVar30 * fVar48;
      local_588._12_4_ = fVar48 * fVar37;
      local_578._12_4_ = auVar38._0_4_ * fVar48;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5[1].ptr_ofs;
      lVar19 = i * pRVar5[1].stride;
      pt.field_0 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pcVar6 + lVar19);
      _local_598 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                   *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)
                    &((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar19 + 0x10))->field_1;
      local_588 = *(undefined1 (*) [16])
                   &((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar19 + 0x20))->field_1;
      local_578 = *(undefined1 (*) [16])
                   &((anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar6 + lVar19 + 0x30))->field_1;
    }
    MotionDerivativeCoefficients::MotionDerivativeCoefficients
              ((MotionDerivativeCoefficients *)&bt,(AffineSpace3ff *)&nom,(AffineSpace3ff *)&pt);
    VVar13 = nom;
    VVar12 = pt;
    uVar14 = nom.field_0.m128[3];
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0;
    fVar37 = (float)local_518._12_4_ * (float)local_588._12_4_ +
             fStack_58c * fStack_51c +
             (float)local_578._12_4_ * (float)local_508._12_4_ +
             nom.field_0.m128[3] * pt.field_0.m128[3];
    fVar30 = -fVar37;
    fVar22 = fVar37;
    auVar38._0_4_ = (float)local_588._12_4_;
    uVar11 = pt.field_0.m128[3];
    if (fVar37 < fVar30) {
      fVar22 = fVar30;
      auVar38._0_4_ = -(float)local_588._12_4_;
      uVar11 = -pt.field_0.m128[3];
    }
    fVar48 = ABS(fVar37);
    fVar54 = ((((fVar48 * -0.0043095737 + 0.0192803) * fVar48 + -0.04489909) * fVar48 + 0.08785567)
              * fVar48 + -0.21450998) * fVar48 + 1.5707952;
    fVar29 = 1.0 - fVar48;
    fVar40 = nom.field_0.m128[3] * fVar22 - (float)uVar11;
    uVar15 = (int)((uint)(fVar37 < fVar30) << 0x1f) >> 0x1f;
    uVar27 = (int)((uint)(fVar37 < fVar30) << 0x1f) >> 0x1f;
    fVar31 = (float)((uint)-(float)local_578._12_4_ & uVar15 | ~uVar15 & local_578._12_4_);
    fVar23 = (float)((uint)-fStack_58c & uVar27 | ~uVar27 & (uint)fStack_58c);
    local_658._4_4_ = local_508._4_4_;
    fVar30 = fVar22 * (float)local_658._4_4_ - fVar31;
    fVar37 = fVar22 * fStack_51c - fVar23;
    fVar49 = (float)local_518._12_4_ * fVar22 - auVar38._0_4_;
    fVar24 = fVar49 * fVar49 + fVar37 * fVar37 + fVar30 * fVar30 + fVar40 * fVar40;
    fVar58 = fVar24 * 0.5;
    local_688[4] = 0.9995 < fVar22;
    interval.lower = tmin;
    interval.upper = tmax;
    for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
      for (iVar17 = 0; iVar17 != 2; iVar17 = iVar17 + 1) {
        uVar20 = (ulong)(iVar17 != 0) << 4 | 4;
        for (iVar18 = 0; iVar18 != 2; iVar18 = iVar18 + 1) {
          p0.field_0.m128[1] = (float)*(undefined4 *)((long)&(obbox0->lower).field_0 + uVar20);
          p0.field_0.m128[0] = (&obbox0->lower)[iVar16 != 0].field_0.m128[0];
          p0.field_0.m128[2] = (&obbox0->lower)[iVar18 != 0].field_0.m128[2];
          p0.field_0.m128[3] = 0.0;
          p1.field_0.m128[1] = *(float *)((long)&(obbox1->lower).field_0 + uVar20);
          p1.field_0.m128[0] = (&obbox1->lower)[iVar16 != 0].field_0.m128[0];
          p1.field_0.m128[2] = (&obbox1->lower)[iVar18 != 0].field_0.m128[2];
          p1.field_0.m128[3] = 0.0;
          for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
            MotionDerivative::MotionDerivative
                      (&motionDerivative,(MotionDerivativeCoefficients *)&bt,(int)lVar19,&p0,&p1);
            uVar15 = MotionDerivative::findRoots
                               (&motionDerivative,&interval,
                                (bbox0->lower).field_0.m128[lVar19] -
                                (bbox1->lower).field_0.m128[lVar19],(float *)&denom,0x20);
            uVar21 = 0;
            while( true ) {
              auVar52._4_4_ = local_518._12_4_;
              auVar52._0_4_ = fVar24;
              auVar52._8_4_ = local_518._12_4_;
              auVar52._12_4_ = local_518._12_4_;
              auVar52 = rsqrtss(auVar52,auVar52);
              local_3a8 = (uint)(byte)local_688[4];
              local_5f8 = VVar12.field_0._0_4_;
              fStack_5f4 = VVar12.field_0._4_4_;
              fStack_5f0 = VVar12.field_0._8_4_;
              local_5b8 = VVar13.field_0._0_4_;
              fStack_5b4 = VVar13.field_0._4_4_;
              fStack_5b0 = VVar13.field_0._8_4_;
              local_5d8 = local_598._0_4_;
              fStack_5d4 = local_598._4_4_;
              fStack_5d0 = local_598._8_4_;
              local_648._0_4_ = local_528._0_4_;
              local_648._4_4_ = local_528._4_4_;
              fStack_640 = local_528._8_4_;
              local_558 = local_588._0_4_;
              fStack_554 = local_588._4_4_;
              fStack_550 = local_588._8_4_;
              local_568 = local_578._0_4_;
              fStack_564 = local_578._4_4_;
              local_658._0_4_ = local_508._0_4_;
              fStack_650 = local_508._8_4_;
              local_628 = auVar52._0_4_;
              if (uVar15 == uVar21) break;
              fVar61 = denom.field_0.m128[uVar21];
              fVar28 = 1.0 - fVar61;
              bt_1.lower.field_0.m128[0] =
                   (bbox0->lower).field_0.m128[0] * fVar28 + (bbox1->lower).field_0.m128[0] * fVar61
              ;
              bt_1.lower.field_0.m128[1] =
                   (bbox0->lower).field_0.m128[1] * fVar28 + (bbox1->lower).field_0.m128[1] * fVar61
              ;
              bt_1.lower.field_0.m128[2] =
                   (bbox0->lower).field_0.m128[2] * fVar28 + (bbox1->lower).field_0.m128[2] * fVar61
              ;
              bt_1.lower.field_0.m128[3] =
                   (bbox0->lower).field_0.m128[3] * fVar28 + (bbox1->lower).field_0.m128[3] * fVar61
              ;
              bt_1.upper.field_0.m128[0] =
                   (bbox0->upper).field_0.m128[0] * fVar28 + (bbox1->upper).field_0.m128[0] * fVar61
              ;
              bt_1.upper.field_0.m128[1] =
                   (bbox0->upper).field_0.m128[1] * fVar28 + (bbox1->upper).field_0.m128[1] * fVar61
              ;
              bt_1.upper.field_0.m128[2] =
                   (bbox0->upper).field_0.m128[2] * fVar28 + (bbox1->upper).field_0.m128[2] * fVar61
              ;
              bt_1.upper.field_0.m128[3] =
                   (bbox0->upper).field_0.m128[3] * fVar28 + (bbox1->upper).field_0.m128[3] * fVar61
              ;
              fVar26 = SQRT(fVar29);
              if (fVar29 < 0.0) {
                fVar26 = sqrtf(fVar29);
              }
              fVar25 = 1.5707964 - fVar26 * fVar54;
              fVar26 = 0.0;
              if (0.0 <= fVar25) {
                fVar26 = fVar25;
              }
              fVar32 = (float)(-(uint)(1.0 < fVar48) & 0x7fc00000 |
                              ~-(uint)(1.0 < fVar48) &
                              (uint)(1.5707964 -
                                    (float)((uint)-fVar26 & -(uint)(fVar22 < 0.0) |
                                           ~-(uint)(fVar22 < 0.0) & (uint)fVar26))) * fVar61;
              fVar34 = floorf(fVar32 * 0.63661975);
              fVar32 = fVar32 - fVar34 * 1.5707964;
              fVar26 = fVar32 * fVar32;
              fVar25 = ((((fVar26 * -2.5963018e-07 + 2.4756235e-05) * fVar26 + -0.001388833) *
                         fVar26 + 0.04166664) * fVar26 + -0.5) * fVar26 + 1.0;
              fVar32 = (((((fVar26 * -2.5029328e-08 + 2.7600126e-06) * fVar26 + -0.00019842605) *
                          fVar26 + 0.008333348) * fVar26 + -0.16666667) * fVar26 + 1.0) * fVar32;
              fVar26 = fVar32;
              if (((int)fVar34 & 1U) != 0) {
                fVar26 = fVar25;
                fVar25 = fVar32;
              }
              uVar27 = (int)fVar34 & 3;
              if (uVar27 - 1 < 2) {
                fVar25 = -fVar25;
              }
              if (uVar27 < 2) {
                fVar26 = -fVar26;
              }
              fVar32 = local_628 * 1.5 - local_628 * local_628 * fVar58 * local_628;
              fVar34 = fVar28 * (float)uVar14 + (float)uVar11 * fVar61;
              fVar63 = fVar28 * (float)local_518._12_4_ + fVar61 * auVar38._0_4_;
              fVar35 = fVar28 * (float)local_658._4_4_ + fVar31 * fVar61;
              fVar36 = fVar28 * fStack_51c + fVar23 * fVar61;
              fVar62 = fVar63 * fVar63 + fVar36 * fVar36 + fVar35 * fVar35 + fVar34 * fVar34;
              auVar52 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
              fVar41 = auVar52._0_4_;
              fVar41 = fVar41 * fVar41 * fVar62 * -0.5 * fVar41 + fVar41 * 1.5;
              if (0.9995 < fVar22) {
                fVar34 = fVar34 * fVar41;
              }
              else {
                fVar34 = fVar25 * (float)uVar14 + fVar32 * fVar40 * fVar26;
              }
              local_688._5_3_ = 0;
              uVar27 = (int)(local_3a8 << 0x1f) >> 0x1f;
              uVar60 = (int)(local_688._4_4_ << 0x1f) >> 0x1f;
              fVar43 = (float)(~uVar27 & (uint)(fVar25 * (float)local_658._4_4_ +
                                               fVar26 * fVar32 * fVar30) |
                              (uint)(fVar41 * fVar35) & uVar27);
              fVar55 = (float)(~uVar60 & (uint)(fVar25 * fStack_51c + fVar26 * fVar32 * fVar37) |
                              (uint)(fVar41 * fVar36) & uVar60);
              fVar67 = (float)(-(uint)(0.9995 < fVar22) & (uint)(fVar63 * fVar41) |
                              ~-(uint)(0.9995 < fVar22) &
                              (uint)(fVar25 * (float)local_518._12_4_ + fVar49 * fVar32 * fVar26));
              fVar26 = local_5b8 * fVar28 + local_5f8 * fVar61;
              fVar32 = (float)local_648._0_4_ * fVar28 + local_5d8 * fVar61;
              fVar35 = (float)local_648._4_4_ * fVar28 + fStack_5d4 * fVar61;
              fVar65 = (float)local_518._0_4_ * fVar28 + local_558 * fVar61;
              fVar68 = (float)local_518._4_4_ * fVar28 + fStack_554 * fVar61;
              fVar44 = (float)local_518._8_4_ * fVar28 + fStack_550 * fVar61;
              fVar41 = (float)local_658._0_4_ * fVar28 + local_568 * fVar61;
              fVar62 = (float)local_658._4_4_ * fVar28 + fStack_564 * fVar61;
              fVar63 = fStack_650 * fVar28 + (float)local_578._8_4_ * fVar61;
              fVar57 = fVar34 * fVar55 + fVar43 * fVar67;
              fVar56 = fVar34 * fVar55 - fVar43 * fVar67;
              fVar25 = fVar43 * fVar43 - fVar34 * fVar34;
              fVar66 = fVar43 * fVar43 + fVar34 * fVar34 + -fVar55 * fVar55 + -fVar67 * fVar67;
              fVar64 = fVar55 * fVar55 + fVar25 + -fVar67 * fVar67;
              fVar69 = fVar34 * fVar67 - fVar43 * fVar55;
              fVar45 = fVar43 * fVar55 + fVar34 * fVar67;
              fVar36 = fVar55 * fVar67 + fVar43 * fVar34;
              fVar34 = fVar55 * fVar67 - fVar43 * fVar34;
              fVar25 = fVar67 * fVar67 + fVar25 + -fVar55 * fVar55;
              fVar57 = fVar57 + fVar57;
              fVar69 = fVar69 + fVar69;
              fVar56 = fVar56 + fVar56;
              fVar36 = fVar36 + fVar36;
              fVar45 = fVar45 + fVar45;
              fVar34 = fVar34 + fVar34;
              fVar67 = fVar66 * 1.0 + fVar57 * 0.0 + fVar69 * 0.0;
              fVar43 = fVar66 * 0.0 + fVar57 * 1.0 + fVar69 * 0.0;
              fVar55 = fVar66 * 0.0 + fVar57 * 0.0 + fVar69 * 1.0;
              fVar66 = fVar66 * 0.0 + fVar57 * 0.0 + fVar69 * 0.0;
              fVar57 = fVar56 * 1.0 + fVar64 * 0.0 + fVar36 * 0.0;
              fVar69 = fVar56 * 0.0 + fVar64 * 1.0 + fVar36 * 0.0;
              fVar39 = fVar56 * 0.0 + fVar64 * 0.0 + fVar36 * 1.0;
              fVar56 = fVar56 * 0.0 + fVar64 * 0.0 + fVar36 * 0.0;
              fVar64 = fVar45 * 1.0 + fVar34 * 0.0 + fVar25 * 0.0;
              fVar46 = fVar45 * 0.0 + fVar34 * 1.0 + fVar25 * 0.0;
              fVar47 = fVar45 * 0.0 + fVar34 * 0.0 + fVar25 * 1.0;
              fVar45 = fVar45 * 0.0 + fVar34 * 0.0 + fVar25 * 0.0;
              fVar25 = fVar28 * p0.field_0.m128[0] + fVar61 * p1.field_0.m128[0];
              fVar34 = fVar28 * p0.field_0.m128[1] + fVar61 * p1.field_0.m128[1];
              fVar36 = fVar28 * p0.field_0.m128[2] + fVar61 * p1.field_0.m128[2];
              pt_1.field_0.m128[3] =
                   fVar36 * (fVar65 * fVar66 + fVar68 * fVar56 + fVar44 * fVar45) +
                   fVar41 * fVar66 + fVar62 * fVar56 + fVar63 * fVar45 + 0.0 +
                   fVar34 * (fVar32 * fVar66 + fVar35 * fVar56 + fVar45 * 0.0) +
                   fVar25 * (fVar26 * fVar66 + fVar56 * 0.0 + fVar45 * 0.0);
              pt_1.field_0.m128[0] =
                   fVar36 * (fVar65 * fVar67 + fVar68 * fVar57 + fVar44 * fVar64) +
                   fVar41 * fVar67 + fVar62 * fVar57 + fVar63 * fVar64 +
                   fStack_5b4 * fVar28 + fStack_5f4 * fVar61 + 0.0 +
                   fVar34 * (fVar32 * fVar67 + fVar35 * fVar57 + fVar64 * 0.0) +
                   fVar25 * (fVar26 * fVar67 + fVar57 * 0.0 + fVar64 * 0.0);
              pt_1.field_0.m128[1] =
                   fVar36 * (fVar65 * fVar43 + fVar68 * fVar69 + fVar44 * fVar46) +
                   fVar41 * fVar43 + fVar62 * fVar69 + fVar63 * fVar46 +
                   fStack_5b0 * fVar28 + fStack_5f0 * fVar61 + 0.0 +
                   fVar34 * (fVar32 * fVar43 + fVar35 * fVar69 + fVar46 * 0.0) +
                   fVar25 * (fVar26 * fVar43 + fVar69 * 0.0 + fVar46 * 0.0);
              pt_1.field_0.m128[2] =
                   fVar36 * (fVar65 * fVar55 + fVar68 * fVar39 + fVar44 * fVar47) +
                   fVar41 * fVar55 + fVar62 * fVar39 + fVar63 * fVar47 +
                   fStack_640 * fVar28 + fStack_5d0 * fVar61 + 0.0 +
                   fVar34 * (fVar32 * fVar55 + fVar35 * fVar39 + fVar47 * 0.0) +
                   fVar25 * (fVar26 * fVar55 + fVar39 * 0.0 + fVar47 * 0.0);
              fVar26 = pt_1.field_0.m128[lVar19] - bt_1.lower.field_0.m128[lVar19];
              fVar61 = (__return_storage_ptr__->lower).field_0.m128[lVar19];
              if (fVar61 <= fVar26) {
                fVar26 = fVar61;
              }
              (__return_storage_ptr__->lower).field_0.m128[lVar19] = fVar26;
              uVar21 = uVar21 + 1;
            }
            uVar15 = MotionDerivative::findRoots
                               (&motionDerivative,&interval,
                                (bbox0->upper).field_0.m128[lVar19] -
                                (bbox1->upper).field_0.m128[lVar19],(float *)&denom,0x20);
            for (uVar21 = 0; uVar15 != uVar21; uVar21 = uVar21 + 1) {
              fVar61 = denom.field_0.m128[uVar21];
              fVar28 = 1.0 - fVar61;
              bt_1.upper.field_0.m128[0] =
                   (bbox0->upper).field_0.m128[0] * fVar28 + (bbox1->upper).field_0.m128[0] * fVar61
              ;
              bt_1.upper.field_0.m128[1] =
                   (bbox0->upper).field_0.m128[1] * fVar28 + (bbox1->upper).field_0.m128[1] * fVar61
              ;
              bt_1.upper.field_0.m128[2] =
                   (bbox0->upper).field_0.m128[2] * fVar28 + (bbox1->upper).field_0.m128[2] * fVar61
              ;
              bt_1.upper.field_0.m128[3] =
                   (bbox0->upper).field_0.m128[3] * fVar28 + (bbox1->upper).field_0.m128[3] * fVar61
              ;
              fVar26 = SQRT(fVar29);
              if (fVar29 < 0.0) {
                fVar26 = sqrtf(fVar29);
              }
              fVar25 = 1.5707964 - fVar26 * fVar54;
              fVar26 = 0.0;
              if (0.0 <= fVar25) {
                fVar26 = fVar25;
              }
              fVar32 = (float)(-(uint)(1.0 < fVar48) & 0x7fc00000 |
                              ~-(uint)(1.0 < fVar48) &
                              (uint)(1.5707964 -
                                    (float)((uint)-fVar26 & -(uint)(fVar22 < 0.0) |
                                           ~-(uint)(fVar22 < 0.0) & (uint)fVar26))) * fVar61;
              fVar34 = floorf(fVar32 * 0.63661975);
              fVar32 = fVar32 - fVar34 * 1.5707964;
              fVar26 = fVar32 * fVar32;
              fVar25 = ((((fVar26 * -2.5963018e-07 + 2.4756235e-05) * fVar26 + -0.001388833) *
                         fVar26 + 0.04166664) * fVar26 + -0.5) * fVar26 + 1.0;
              fVar32 = (((((fVar26 * -2.5029328e-08 + 2.7600126e-06) * fVar26 + -0.00019842605) *
                          fVar26 + 0.008333348) * fVar26 + -0.16666667) * fVar26 + 1.0) * fVar32;
              fVar26 = fVar32;
              if (((int)fVar34 & 1U) != 0) {
                fVar26 = fVar25;
                fVar25 = fVar32;
              }
              uVar27 = (int)fVar34 & 3;
              if (uVar27 - 1 < 2) {
                fVar25 = -fVar25;
              }
              if (uVar27 < 2) {
                fVar26 = -fVar26;
              }
              fVar32 = local_628 * 1.5 - local_628 * local_628 * fVar58 * local_628;
              fVar34 = fVar28 * (float)uVar14 + (float)uVar11 * fVar61;
              fVar63 = fVar28 * (float)local_518._12_4_ + fVar61 * auVar38._0_4_;
              fVar35 = fVar28 * (float)local_658._4_4_ + fVar31 * fVar61;
              fVar36 = fVar28 * fStack_51c + fVar23 * fVar61;
              fVar62 = fVar63 * fVar63 + fVar36 * fVar36 + fVar35 * fVar35 + fVar34 * fVar34;
              auVar52 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
              fVar41 = auVar52._0_4_;
              fVar41 = fVar41 * fVar41 * fVar62 * -0.5 * fVar41 + fVar41 * 1.5;
              if (0.9995 < fVar22) {
                fVar34 = fVar34 * fVar41;
              }
              else {
                fVar34 = fVar25 * (float)uVar14 + fVar32 * fVar40 * fVar26;
              }
              local_688._5_3_ = 0;
              uVar27 = (int)(local_3a8 << 0x1f) >> 0x1f;
              uVar60 = (int)(local_688._4_4_ << 0x1f) >> 0x1f;
              fVar44 = (float)(~uVar27 & (uint)(fVar25 * (float)local_658._4_4_ +
                                               fVar26 * fVar32 * fVar30) |
                              (uint)(fVar41 * fVar35) & uVar27);
              fVar55 = (float)(~uVar60 & (uint)(fVar25 * fStack_51c + fVar26 * fVar32 * fVar37) |
                              (uint)(fVar41 * fVar36) & uVar60);
              fVar43 = (float)(-(uint)(0.9995 < fVar22) & (uint)(fVar63 * fVar41) |
                              ~-(uint)(0.9995 < fVar22) &
                              (uint)(fVar25 * (float)local_518._12_4_ + fVar49 * fVar32 * fVar26));
              fVar25 = local_5b8 * fVar28 + local_5f8 * fVar61;
              fVar32 = (float)local_648._0_4_ * fVar28 + local_5d8 * fVar61;
              fVar35 = (float)local_648._4_4_ * fVar28 + fStack_5d4 * fVar61;
              fVar41 = (float)local_518._0_4_ * fVar28 + local_558 * fVar61;
              fVar62 = (float)local_518._4_4_ * fVar28 + fStack_554 * fVar61;
              fVar63 = (float)local_518._8_4_ * fVar28 + fStack_550 * fVar61;
              fVar65 = (float)local_658._0_4_ * fVar28 + local_568 * fVar61;
              fVar66 = (float)local_658._4_4_ * fVar28 + fStack_564 * fVar61;
              fVar67 = fStack_650 * fVar28 + (float)local_578._8_4_ * fVar61;
              fVar57 = fVar34 * fVar55 + fVar44 * fVar43;
              fVar56 = fVar34 * fVar55 - fVar44 * fVar43;
              fVar69 = fVar44 * fVar44 - fVar34 * fVar34;
              fVar68 = fVar44 * fVar44 + fVar34 * fVar34 + -fVar55 * fVar55 + -fVar43 * fVar43;
              fVar64 = fVar55 * fVar55 + fVar69 + -fVar43 * fVar43;
              fVar26 = fVar34 * fVar43 - fVar44 * fVar55;
              fVar45 = fVar44 * fVar55 + fVar34 * fVar43;
              fVar36 = fVar55 * fVar43 + fVar44 * fVar34;
              fVar50 = fVar55 * fVar43 - fVar44 * fVar34;
              fVar34 = fVar43 * fVar43 + fVar69 + -fVar55 * fVar55;
              fVar57 = fVar57 + fVar57;
              fVar26 = fVar26 + fVar26;
              fVar56 = fVar56 + fVar56;
              fVar36 = fVar36 + fVar36;
              fVar45 = fVar45 + fVar45;
              fVar50 = fVar50 + fVar50;
              fVar43 = fVar68 * 1.0 + fVar57 * 0.0 + fVar26 * 0.0;
              fVar44 = fVar68 * 0.0 + fVar57 * 1.0 + fVar26 * 0.0;
              fVar55 = fVar68 * 0.0 + fVar57 * 0.0 + fVar26 * 1.0;
              fVar68 = fVar68 * 0.0 + fVar57 * 0.0 + fVar26 * 0.0;
              fVar57 = fVar56 * 1.0 + fVar64 * 0.0 + fVar36 * 0.0;
              fVar69 = fVar56 * 0.0 + fVar64 * 1.0 + fVar36 * 0.0;
              fVar39 = fVar56 * 0.0 + fVar64 * 0.0 + fVar36 * 1.0;
              fVar56 = fVar56 * 0.0 + fVar64 * 0.0 + fVar36 * 0.0;
              fVar64 = fVar45 * 1.0 + fVar50 * 0.0 + fVar34 * 0.0;
              fVar46 = fVar45 * 0.0 + fVar50 * 1.0 + fVar34 * 0.0;
              fVar47 = fVar45 * 0.0 + fVar50 * 0.0 + fVar34 * 1.0;
              fVar45 = fVar45 * 0.0 + fVar50 * 0.0 + fVar34 * 0.0;
              fVar26 = fVar28 * p0.field_0.m128[0] + fVar61 * p1.field_0.m128[0];
              fVar34 = fVar28 * p0.field_0.m128[1] + fVar61 * p1.field_0.m128[1];
              fVar36 = fVar28 * p0.field_0.m128[2] + fVar61 * p1.field_0.m128[2];
              pt_1.field_0.m128[3] =
                   fVar36 * (fVar41 * fVar68 + fVar62 * fVar56 + fVar63 * fVar45) +
                   fVar65 * fVar68 + fVar66 * fVar56 + fVar67 * fVar45 + 0.0 +
                   fVar34 * (fVar32 * fVar68 + fVar35 * fVar56 + fVar45 * 0.0) +
                   fVar26 * (fVar25 * fVar68 + fVar56 * 0.0 + fVar45 * 0.0);
              pt_1.field_0.m128[0] =
                   fVar36 * (fVar41 * fVar43 + fVar62 * fVar57 + fVar63 * fVar64) +
                   fVar65 * fVar43 + fVar66 * fVar57 + fVar67 * fVar64 +
                   fStack_5b4 * fVar28 + fStack_5f4 * fVar61 + 0.0 +
                   fVar34 * (fVar32 * fVar43 + fVar35 * fVar57 + fVar64 * 0.0) +
                   fVar26 * (fVar25 * fVar43 + fVar57 * 0.0 + fVar64 * 0.0);
              pt_1.field_0.m128[1] =
                   fVar36 * (fVar41 * fVar44 + fVar62 * fVar69 + fVar63 * fVar46) +
                   fVar65 * fVar44 + fVar66 * fVar69 + fVar67 * fVar46 +
                   fStack_5b0 * fVar28 + fStack_5f0 * fVar61 + 0.0 +
                   fVar34 * (fVar32 * fVar44 + fVar35 * fVar69 + fVar46 * 0.0) +
                   fVar26 * (fVar25 * fVar44 + fVar69 * 0.0 + fVar46 * 0.0);
              pt_1.field_0.m128[2] =
                   fVar36 * (fVar41 * fVar55 + fVar62 * fVar39 + fVar63 * fVar47) +
                   fVar65 * fVar55 + fVar66 * fVar39 + fVar67 * fVar47 +
                   fStack_640 * fVar28 + fStack_5d0 * fVar61 + 0.0 +
                   fVar34 * (fVar32 * fVar55 + fVar35 * fVar39 + fVar47 * 0.0) +
                   fVar26 * (fVar25 * fVar55 + fVar39 * 0.0 + fVar47 * 0.0);
              fVar26 = pt_1.field_0.m128[lVar19] - bt_1.upper.field_0.m128[lVar19];
              fVar61 = (__return_storage_ptr__->upper).field_0.m128[lVar19];
              if (fVar26 <= fVar61) {
                fVar26 = fVar61;
              }
              (__return_storage_ptr__->upper).field_0.m128[lVar19] = fVar26;
            }
          }
        }
      }
    }
    return __return_storage_ptr__;
  }
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar5 = (this->l2w_buf).items;
    RVar4 = pRVar5->format;
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      fVar26 = *(float *)(pcVar6 + lVar19 + 0x10);
      fVar25 = *(float *)(pcVar6 + lVar19);
      in_XMM14_Da = *(float *)(pcVar6 + lVar19 + 4);
      in_XMM11_Da = *(float *)(pcVar6 + lVar19 + 8);
      fVar28 = *(float *)(pcVar6 + lVar19 + 0x20);
      fVar34 = 0.0;
      in_XMM14_Db = *(float *)(pcVar6 + lVar19 + 0x14);
      in_XMM14_Dc = *(float *)(pcVar6 + lVar19 + 0x24);
      in_XMM14_Dd = 0.0;
      in_XMM11_Db = *(float *)(pcVar6 + lVar19 + 0x18);
      in_XMM11_Dc = *(float *)(pcVar6 + lVar19 + 0x28);
      in_XMM11_Dd = 0.0;
      local_698._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
      local_698._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      local_658._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x2c);
      local_658._4_4_ = 0.0;
      in_XMM0_Dc = 0.0;
      in_XMM0_Dd = 0.0;
      fStack_690 = (float)local_658._0_4_;
      fStack_68c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      fVar25 = *(float *)(pcVar6 + lVar19);
      fVar26 = (float)*(undefined8 *)(pcVar6 + lVar19 + 4);
      fVar28 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
      fVar34 = 0.0;
      in_XMM14_Da = *(float *)(pcVar6 + lVar19 + 0xc);
      in_XMM14_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
      in_XMM14_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
      in_XMM14_Dd = 0.0;
      in_XMM11_Da = *(float *)(pcVar6 + lVar19 + 0x18);
      in_XMM11_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      in_XMM11_Dd = 0.0;
      local_658._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x28);
      local_658._4_4_ = *(float *)((long)(pcVar6 + lVar19 + 0x28) + 4);
      in_XMM0_Dc = 0.0;
      in_XMM0_Dd = 0.0;
      local_698._4_4_ = local_658._0_4_;
      local_698._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      fStack_690 = (float)local_658._4_4_;
      fStack_68c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      in_XMM11_Da = *(float *)(pcVar6 + lVar19 + 0x10);
      in_XMM11_Db = *(float *)((long)(pcVar6 + lVar19 + 0x10) + 4);
      uVar3 = *(undefined8 *)(pcVar6 + lVar19 + 0x34);
      fVar25 = *(float *)(pcVar6 + lVar19);
      in_XMM10._4_4_ = 0.0;
      in_XMM10._0_4_ = fVar25;
      in_XMM14_Db = *(float *)(pcVar6 + lVar19 + 4);
      in_XMM11_Dc = *(float *)(pcVar6 + lVar19 + 8);
      in_XMM14_Da = *(float *)(pcVar6 + lVar19 + 0xc);
      in_XMM10._8_8_ = uVar3;
      auVar38._0_4_ = *(float *)(pcVar6 + lVar19 + 0x24);
      fVar34 = *(float *)(pcVar6 + lVar19 + 0x28);
      fVar22 = *(float *)(pcVar6 + lVar19 + 0x2c);
      fVar30 = *(float *)(pcVar6 + lVar19 + 0x30);
      fVar48 = fVar30 * fVar30 + fVar22 * fVar22 + auVar38._0_4_ * auVar38._0_4_ + fVar34 * fVar34;
      auVar52 = rsqrtss(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
      fVar37 = auVar52._0_4_;
      fVar37 = fVar37 * fVar37 * fVar48 * -0.5 * fVar37 + fVar37 * 1.5;
      fVar34 = fVar34 * fVar37;
      in_XMM14_Dd = fVar22 * fVar37;
      in_XMM11_Dd = fVar37 * fVar30;
      fVar26 = (float)uVar3;
      fVar28 = (float)((ulong)uVar3 >> 0x20);
      in_XMM14_Dc = *(float *)(pcVar6 + lVar19 + 0x3c);
      in_XMM0_Dc = 0.0;
      in_XMM0_Dd = 0.0;
      local_698._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      local_698._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      fStack_690 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      fStack_68c = auVar38._0_4_ * fVar37;
      local_658._0_4_ = in_XMM14_Dc;
      local_658._4_4_ = in_XMM14_Dd;
    }
    else {
      fVar25 = in_XMM6_Da;
      fVar26 = in_XMM6_Db;
      fVar28 = in_XMM6_Dc;
      fVar34 = in_XMM6_Dd;
      local_658._0_4_ = tmin;
      local_658._4_4_ = in_XMM0_Db;
      if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar19 = pRVar5->stride * i;
        pfVar1 = (float *)(pcVar6 + lVar19);
        fVar25 = *pfVar1;
        fVar26 = pfVar1[1];
        fVar28 = pfVar1[2];
        fVar34 = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar19 + 0x10);
        in_XMM14_Da = *pfVar1;
        in_XMM14_Db = pfVar1[1];
        in_XMM14_Dc = pfVar1[2];
        in_XMM14_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar6 + lVar19 + 0x20);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        pauVar2 = (undefined1 (*) [16])(pcVar6 + lVar19 + 0x30);
        in_XMM0_Dc = *(float *)(*pauVar2 + 8);
        in_XMM0_Dd = *(float *)(*pauVar2 + 0xc);
        _local_698 = *pauVar2;
        local_658._0_4_ = *(float *)*pauVar2;
        local_658._4_4_ = *(float *)(*pauVar2 + 4);
      }
    }
    RVar4 = pRVar5->format;
    if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = i * pRVar5->stride;
      in_XMM15_Db = *(float *)(pcVar6 + lVar19 + 0x10);
      in_XMM15_Da = *(float *)(pcVar6 + lVar19);
      local_658._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
      in_XMM15_Dc = *(float *)(pcVar6 + lVar19 + 0x20);
      in_XMM15_Dd = 0.0;
      in_XMM10._4_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x14);
      in_XMM10._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 4);
      in_XMM10._8_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x24);
      in_XMM10._12_4_ = 0.0;
      local_658._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      in_XMM0_Dc = *(float *)(pcVar6 + lVar19 + 0x28);
      in_XMM0_Dd = 0.0;
      local_688._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
      local_688._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      fStack_680 = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x2c);
      fStack_67c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = i * pRVar5->stride;
      in_XMM15_Da = *(float *)(pcVar6 + lVar19);
      in_XMM15_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 4);
      in_XMM15_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
      in_XMM15_Dd = 0.0;
      in_XMM10._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
      in_XMM10._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0xc);
      in_XMM10._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
      in_XMM10._12_4_ = 0.0;
      local_658._4_4_ = (undefined4)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      in_XMM0_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      local_658._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      in_XMM0_Dd = 0.0;
      local_688._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x28);
      local_688._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      fStack_680 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x28) >> 0x20);
      fStack_67c = 0.0;
    }
    else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = i * pRVar5->stride;
      in_XMM15_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x34);
      in_XMM15_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x34) >> 0x20);
      in_XMM15_Da = *(float *)(pcVar6 + lVar19);
      in_XMM0_Dc = *(float *)(pcVar6 + lVar19 + 8);
      auVar38._0_4_ = *(float *)(pcVar6 + lVar19 + 0x24);
      fVar22 = *(float *)(pcVar6 + lVar19 + 0x28);
      fVar30 = *(float *)(pcVar6 + lVar19 + 0x2c);
      fVar37 = *(float *)(pcVar6 + lVar19 + 0x30);
      fVar54 = fVar37 * fVar37 + fVar30 * fVar30 + auVar38._0_4_ * auVar38._0_4_ + fVar22 * fVar22;
      auVar52 = rsqrtss(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
      fVar48 = auVar52._0_4_;
      fVar48 = fVar48 * fVar48 * fVar54 * -0.5 * fVar48 + fVar48 * 1.5;
      in_XMM15_Dd = fVar22 * fVar48;
      in_XMM0_Dd = fVar48 * fVar37;
      local_658._0_4_ = (undefined4)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
      local_658._4_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
      in_XMM10._4_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 4);
      in_XMM10._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0xc);
      in_XMM10._12_4_ = fVar30 * fVar48;
      in_XMM10._8_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x3c);
      local_688._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      local_688._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      fStack_680 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      fStack_67c = auVar38._0_4_ * fVar48;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = i * pRVar5->stride;
      pfVar1 = (float *)(pcVar6 + lVar19);
      in_XMM15_Da = *pfVar1;
      in_XMM15_Db = pfVar1[1];
      in_XMM15_Dc = pfVar1[2];
      in_XMM15_Dd = pfVar1[3];
      in_XMM10 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x10);
      pfVar1 = (float *)(pcVar6 + lVar19 + 0x20);
      local_658._0_4_ = *pfVar1;
      local_658._4_4_ = pfVar1[1];
      in_XMM0_Dc = pfVar1[2];
      in_XMM0_Dd = pfVar1[3];
      _local_688 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x30);
    }
    goto LAB_001cd6c1;
  }
  local_698._0_4_ = (this->super_Geometry).fnumTimeSegments;
  auVar38._0_4_ = (this->super_Geometry).time_range.lower;
  fVar22 = (((float)itime - auVar38._0_4_) /
           ((this->super_Geometry).time_range.upper - auVar38._0_4_)) * (float)local_698._0_4_;
  auVar38._0_4_ = floorf(fVar22);
  if ((float)local_698._0_4_ + -1.0 <= auVar38._0_4_) {
    auVar38._0_4_ = (float)local_698._0_4_ + -1.0;
  }
  fVar30 = 0.0;
  if (0.0 <= auVar38._0_4_) {
    fVar30 = auVar38._0_4_;
  }
  uVar15 = (uint)fVar30;
  pRVar7 = (this->l2w_buf).items;
  pRVar5 = pRVar7 + uVar15;
  RVar4 = pRVar7[uVar15].format;
  auVar38._0_4_ = in_XMM13_Dd;
  if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    in_XMM4_Db = *(float *)(pcVar6 + lVar19 + 0x10);
    in_XMM4_Da = *(float *)(pcVar6 + lVar19);
    in_XMM4_Dc = *(float *)(pcVar6 + lVar19 + 0x20);
    auVar59._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
    auVar59._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
    auVar59._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
    auVar51._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
    auVar51._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
    auVar51._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x28);
    auVar33._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
    auVar33._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
    auVar33._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x2c);
LAB_001cca7a:
    in_XMM12._12_4_ = 0;
    in_XMM12._0_12_ = auVar59;
    in_XMM10._12_4_ = 0.0;
    in_XMM10._0_12_ = auVar51;
    in_XMM4_Dd = 0.0;
    fStack_68c = 0.0;
    _local_698 = auVar33;
  }
  else {
    if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      in_XMM4_Da = *(float *)(pcVar6 + lVar19);
      in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 4);
      in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
      auVar59._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
      auVar59._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      auVar59._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
      auVar51._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      auVar51._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      auVar51._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      auVar33._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x28);
      auVar33._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
      auVar33._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x28) >> 0x20);
      goto LAB_001cca7a;
    }
    if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      uVar3 = *(undefined8 *)(pcVar6 + lVar19 + 0x10);
      in_XMM13_Da = (float)uVar3;
      in_XMM13_Db = (float)((ulong)uVar3 >> 0x20);
      in_XMM13_Dc = 0.0;
      auVar38._0_4_ = 0.0;
      in_XMM4_Da = *(float *)(pcVar6 + lVar19);
      in_XMM12._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
      in_XMM12._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
      fVar37 = *(float *)(pcVar6 + lVar19 + 0x24);
      fVar48 = *(float *)(pcVar6 + lVar19 + 0x28);
      fVar54 = *(float *)(pcVar6 + lVar19 + 0x2c);
      fVar31 = *(float *)(pcVar6 + lVar19 + 0x30);
      in_XMM7 = ZEXT416((uint)fVar31);
      in_XMM9_Db = 0.0;
      in_XMM9_Dc = 0.0;
      in_XMM9_Dd = 0.0;
      fVar24 = fVar31 * fVar31 + fVar54 * fVar54 + fVar37 * fVar37 + fVar48 * fVar48;
      auVar52 = rsqrtss(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar49 = auVar52._0_4_;
      in_XMM9_Da = fVar24 * -0.5 * fVar49;
      auVar42._4_12_ = auVar52._4_12_;
      fVar49 = fVar49 * fVar49 * in_XMM9_Da + fVar49 * 1.5;
      in_XMM6_Da = fVar48 * fVar49;
      in_XMM5 = ZEXT416((uint)(fVar54 * fVar49));
      auVar42._0_4_ = fVar49 * fVar31;
      in_XMM8._0_8_ = auVar42._0_8_;
      in_XMM8._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
      in_XMM8._12_4_ = 0;
      in_XMM10._8_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 8);
      in_XMM10._0_8_ = uVar3;
      in_XMM10._12_4_ = auVar42._0_4_;
      in_XMM4_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x34);
      in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x34) >> 0x20);
      in_XMM6_Db = 0.0;
      in_XMM6_Dd = 0.0;
      in_XMM12._12_4_ = fVar54 * fVar49;
      in_XMM12._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x3c);
      local_698._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
      local_698._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
      fStack_690 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
      fStack_68c = fVar37 * fVar49;
      in_XMM4_Dc = in_XMM6_Dc;
      in_XMM4_Dd = in_XMM6_Da;
    }
    else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar19 = pRVar5->stride * i;
      pfVar1 = (float *)(pcVar6 + lVar19);
      in_XMM4_Da = *pfVar1;
      in_XMM4_Db = pfVar1[1];
      in_XMM12 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x10);
      in_XMM10 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x20);
      _local_698 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x30);
      in_XMM4_Dc = pfVar1[2];
      in_XMM4_Dd = pfVar1[3];
    }
  }
  fVar22 = fVar22 - fVar30;
  pRVar5 = pRVar7 + (uVar15 + 1);
  RVar4 = pRVar7[uVar15 + 1].format;
  if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    local_648._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x10);
    local_648._0_4_ = *(undefined4 *)(pcVar6 + lVar19);
    in_XMM13_Da = *(float *)(pcVar6 + lVar19 + 8);
    in_XMM9_Da = *(float *)(pcVar6 + lVar19 + 0xc);
    fStack_640 = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x20);
    fStack_63c = 0.0;
    in_XMM8._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
    in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
    in_XMM8._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
    in_XMM8._12_4_ = 0;
    in_XMM13_Db = *(float *)(pcVar6 + lVar19 + 0x18);
    in_XMM13_Dc = *(float *)(pcVar6 + lVar19 + 0x28);
    auVar38._0_4_ = 0.0;
    in_XMM9_Db = *(float *)(pcVar6 + lVar19 + 0x1c);
    in_XMM9_Dc = *(float *)(pcVar6 + lVar19 + 0x2c);
    in_XMM9_Dd = 0.0;
  }
  else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    local_648._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 4);
    local_648._0_4_ = *(undefined4 *)(pcVar6 + lVar19);
    fStack_640 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
    fStack_63c = 0.0;
    in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
    in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
    in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
    in_XMM8._12_4_ = 0;
    in_XMM13_Da = *(float *)(pcVar6 + lVar19 + 0x18);
    in_XMM13_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
    in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
    auVar38._0_4_ = 0.0;
    in_XMM9_Da = *(float *)(pcVar6 + lVar19 + 0x24);
    in_XMM9_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x28);
    in_XMM9_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x28) >> 0x20);
    in_XMM9_Dd = 0.0;
  }
  else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    in_XMM13_Da = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
    in_XMM13_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
    fStack_640 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x34) >> 0x20);
    in_XMM13_Dc = *(float *)(pcVar6 + lVar19 + 8);
    in_XMM9_Da = *(float *)(pcVar6 + lVar19 + 0x18);
    in_XMM9_Dd = *(float *)(pcVar6 + lVar19 + 0x24);
    auVar38._0_4_ = *(float *)(pcVar6 + lVar19 + 0x28);
    fVar30 = *(float *)(pcVar6 + lVar19 + 0x2c);
    in_XMM6_Da = *(float *)(pcVar6 + lVar19 + 0x30);
    in_XMM6_Db = 0.0;
    in_XMM6_Dc = 0.0;
    in_XMM6_Dd = 0.0;
    fVar48 = in_XMM6_Da * in_XMM6_Da +
             fVar30 * fVar30 + in_XMM9_Dd * in_XMM9_Dd + auVar38._0_4_ * auVar38._0_4_;
    auVar52 = rsqrtss(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
    fVar37 = auVar52._0_4_;
    auVar38._4_12_ = auVar52._4_12_;
    in_XMM8._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
    in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
    fVar37 = fVar37 * fVar37 * fVar48 * -0.5 * fVar37 + fVar37 * 1.5;
    in_XMM9_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
    in_XMM9_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
    in_XMM9_Dd = in_XMM9_Dd * fVar37;
    in_XMM5._0_4_ = auVar38._0_4_ * fVar37;
    auVar38._0_4_ = fVar37 * in_XMM6_Da;
    in_XMM7._0_8_ = auVar38._0_8_;
    in_XMM7._8_4_ = in_XMM13_Dc;
    in_XMM7._12_4_ = 0;
    in_XMM5._4_4_ = 0;
    in_XMM5._8_4_ = fStack_640;
    in_XMM5._12_4_ = 0;
    local_648._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x34);
    local_648._0_4_ = *(undefined4 *)(pcVar6 + lVar19);
    fStack_63c = in_XMM5._0_4_;
    in_XMM8._12_4_ = fVar30 * fVar37;
    in_XMM8._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x3c);
  }
  else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    _local_648 = *(undefined1 (*) [16])(pcVar6 + lVar19);
    in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x10);
    pfVar1 = (float *)(pcVar6 + lVar19 + 0x20);
    in_XMM13_Da = *pfVar1;
    in_XMM13_Db = pfVar1[1];
    in_XMM13_Dc = pfVar1[2];
    auVar38._0_4_ = pfVar1[3];
    pfVar1 = (float *)(pcVar6 + lVar19 + 0x30);
    in_XMM9_Da = *pfVar1;
    in_XMM9_Db = pfVar1[1];
    in_XMM9_Dc = pfVar1[2];
    in_XMM9_Dd = pfVar1[3];
  }
  fVar29 = 1.0 - fVar22;
  local_658._0_4_ = (this->super_Geometry).fnumTimeSegments;
  fVar31 = (this->super_Geometry).time_range.lower;
  fVar37 = 0.0;
  fVar48 = 0.0;
  fVar58 = 0.0;
  fVar23 = (((float)(itime + 1) - fVar31) / ((this->super_Geometry).time_range.upper - fVar31)) *
           (float)local_658._0_4_;
  auVar53 = in_XMM10;
  fVar54 = fVar22;
  fVar30 = fVar22;
  fStack_564 = fVar22;
  fVar49 = fVar22;
  fVar24 = floorf(fVar23);
  if ((float)local_658._0_4_ + -1.0 <= fVar24) {
    fVar24 = (float)local_658._0_4_ + -1.0;
  }
  fVar40 = 0.0;
  if (0.0 <= fVar24) {
    fVar40 = fVar24;
  }
  fStack_5d4 = 0.0;
  fVar24 = 0.0;
  fVar61 = 0.0;
  uVar15 = (uint)fVar40;
  pRVar5 = pRVar7 + uVar15;
  RVar4 = pRVar7[uVar15].format;
  local_628 = in_XMM12._0_4_;
  fStack_624 = in_XMM12._4_4_;
  fStack_620 = in_XMM12._8_4_;
  fStack_61c = in_XMM12._12_4_;
  local_558 = in_XMM10._0_4_;
  fStack_554 = in_XMM10._4_4_;
  fStack_550 = in_XMM10._8_4_;
  fStack_54c = in_XMM10._12_4_;
  local_638 = in_XMM8._0_4_;
  fStack_634 = in_XMM8._4_4_;
  fStack_630 = in_XMM8._8_4_;
  fStack_62c = in_XMM8._12_4_;
  if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    fVar30 = *(float *)(pcVar6 + lVar19 + 0x10);
    fVar54 = *(float *)(pcVar6 + lVar19);
    fVar31 = *(float *)(pcVar6 + lVar19 + 0xc);
    fStack_564 = *(float *)(pcVar6 + lVar19 + 0x20);
    fVar49 = 0.0;
    auVar53._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x14);
    auVar53._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
    auVar53._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x24);
    auVar53._12_4_ = 0;
    local_658._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
    local_658._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
    fStack_650 = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x28);
    fStack_64c = 0.0;
    fVar37 = *(float *)(pcVar6 + lVar19 + 0x1c);
    fVar48 = *(float *)(pcVar6 + lVar19 + 0x2c);
    in_XMM5 = ZEXT416((uint)fVar48);
    fVar58 = 0.0;
  }
  else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    fVar54 = *(float *)(pcVar6 + lVar19);
    fVar30 = (float)*(undefined8 *)(pcVar6 + lVar19 + 4);
    fStack_564 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
    fVar49 = 0.0;
    auVar53._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
    auVar53._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
    auVar53._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
    auVar53._12_4_ = 0;
    local_658._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
    local_658._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
    fStack_650 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
    fStack_64c = 0.0;
    uVar20 = *(ulong *)(pcVar6 + lVar19 + 0x28);
    in_XMM5._8_8_ = 0;
    in_XMM5._0_8_ = uVar20;
    fVar31 = *(float *)(pcVar6 + lVar19 + 0x24);
    fVar37 = (float)uVar20;
    fVar48 = (float)(uVar20 >> 0x20);
    fVar58 = 0.0;
  }
  else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    fVar54 = *(float *)(pcVar6 + lVar19);
    fVar31 = *(float *)(pcVar6 + lVar19 + 0x18);
    in_XMM6_Da = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
    in_XMM6_Db = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
    in_XMM6_Dc = 0.0;
    in_XMM6_Dd = 0.0;
    fVar30 = *(float *)(pcVar6 + lVar19 + 0x24);
    fVar49 = *(float *)(pcVar6 + lVar19 + 0x28);
    fVar37 = *(float *)(pcVar6 + lVar19 + 0x2c);
    fVar48 = *(float *)(pcVar6 + lVar19 + 0x30);
    fVar26 = fVar48 * fVar48 + fVar37 * fVar37 + fVar30 * fVar30 + fVar49 * fVar49;
    auVar52 = rsqrtss(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    fVar58 = auVar52._0_4_;
    fVar58 = fVar58 * fVar58 * fVar26 * -0.5 * fVar58 + fVar58 * 1.5;
    in_XMM7._0_4_ = fVar30 * fVar58;
    fVar49 = fVar49 * fVar58;
    fVar30 = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x34);
    fStack_650 = (float)*(undefined4 *)(pcVar6 + lVar19 + 8);
    local_658 = (undefined1  [8])*(undefined8 *)(pcVar6 + lVar19 + 0x10);
    fStack_64c = fVar58 * fVar48;
    fStack_564 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x34) >> 0x20);
    auVar53._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 4);
    auVar53._0_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0xc);
    in_XMM5._0_8_ = CONCAT44(fVar37 * fVar58,*(undefined4 *)(pcVar6 + lVar19 + 0x3c));
    in_XMM5._8_8_ = 0;
    auVar53._8_8_ = in_XMM5._0_8_;
    in_XMM7._4_4_ = 0;
    in_XMM7._8_4_ = in_XMM6_Db;
    in_XMM7._12_4_ = 0;
    fVar37 = in_XMM6_Da;
    fVar48 = in_XMM6_Db;
    fVar58 = in_XMM7._0_4_;
  }
  else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = pRVar5->stride * i;
    pfVar1 = (float *)(pcVar6 + lVar19);
    fVar54 = *pfVar1;
    fVar30 = pfVar1[1];
    fStack_564 = pfVar1[2];
    fVar49 = pfVar1[3];
    auVar53 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x10);
    _local_658 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x20);
    pfVar1 = (float *)(pcVar6 + lVar19 + 0x30);
    fVar31 = *pfVar1;
    fVar37 = pfVar1[1];
    fVar48 = pfVar1[2];
    fVar58 = pfVar1[3];
  }
  fVar23 = fVar23 - fVar40;
  pRVar5 = pRVar7 + (uVar15 + 1);
  RVar4 = pRVar7[uVar15 + 1].format;
  if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = i * pRVar5->stride;
    fVar24 = *(float *)(pcVar6 + lVar19 + 0x10);
    fVar40 = *(float *)(pcVar6 + lVar19);
    in_XMM6_Da = *(float *)(pcVar6 + lVar19 + 4);
    fStack_5d4 = *(float *)(pcVar6 + lVar19 + 0x20);
    fVar61 = 0.0;
    in_XMM6_Db = *(float *)(pcVar6 + lVar19 + 0x14);
    in_XMM6_Dc = *(float *)(pcVar6 + lVar19 + 0x24);
    in_XMM6_Dd = 0.0;
    in_XMM5._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x18);
    in_XMM5._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 8);
    in_XMM5._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x28);
    in_XMM5._12_4_ = 0;
    in_XMM7._4_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x1c);
    in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0xc);
    in_XMM7._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 0x2c);
    in_XMM7._12_4_ = 0;
  }
  else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = i * pRVar5->stride;
    fVar24 = (float)*(undefined8 *)(pcVar6 + lVar19 + 4);
    fStack_5d4 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 4) >> 0x20);
    fVar40 = *(float *)(pcVar6 + lVar19);
    fVar61 = 0.0;
    in_XMM6_Db = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x10);
    in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x10) >> 0x20);
    in_XMM6_Da = *(float *)(pcVar6 + lVar19 + 0xc);
    in_XMM6_Dd = 0.0;
    in_XMM5._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
    in_XMM5._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x18);
    in_XMM5._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
    in_XMM5._12_4_ = 0;
    in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x28);
    in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x24);
    in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x28) >> 0x20);
    in_XMM7._12_4_ = 0;
  }
  else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = i * pRVar5->stride;
    fVar40 = *(float *)(pcVar6 + lVar19);
    in_XMM6_Db = *(float *)(pcVar6 + lVar19 + 4);
    in_XMM6_Da = *(float *)(pcVar6 + lVar19 + 0xc);
    fVar26 = *(float *)(pcVar6 + lVar19 + 0x24);
    fVar61 = *(float *)(pcVar6 + lVar19 + 0x28);
    fVar24 = *(float *)(pcVar6 + lVar19 + 0x2c);
    fVar28 = *(float *)(pcVar6 + lVar19 + 0x30);
    fVar25 = fVar28 * fVar28 + fVar24 * fVar24 + fVar26 * fVar26 + fVar61 * fVar61;
    auVar52 = rsqrtss(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
    fVar34 = auVar52._0_4_;
    fVar25 = fVar34 * fVar34 * fVar25 * -0.5 * fVar34 + fVar34 * 1.5;
    fVar61 = fVar61 * fVar25;
    in_XMM6_Dd = fVar24 * fVar25;
    in_XMM5._8_4_ = *(undefined4 *)(pcVar6 + lVar19 + 8);
    in_XMM5._0_8_ = *(undefined8 *)(pcVar6 + lVar19 + 0x10);
    in_XMM5._12_4_ = fVar25 * fVar28;
    fStack_5d4 = (float)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x34) >> 0x20);
    fVar24 = (float)*(undefined8 *)(pcVar6 + lVar19 + 0x34);
    in_XMM6_Dc = *(float *)(pcVar6 + lVar19 + 0x3c);
    local_688._4_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar6 + lVar19 + 0x1c) >> 0x20);
    in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar19 + 0x1c);
    in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar19 + 0x18);
    in_XMM7._8_4_ = local_688._4_4_;
    in_XMM7._12_4_ = fVar26 * fVar25;
  }
  else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
    pcVar6 = pRVar5->ptr_ofs;
    lVar19 = i * pRVar5->stride;
    pfVar1 = (float *)(pcVar6 + lVar19);
    fVar40 = *pfVar1;
    fVar24 = pfVar1[1];
    fStack_5d4 = pfVar1[2];
    fVar61 = pfVar1[3];
    pfVar1 = (float *)(pcVar6 + lVar19 + 0x10);
    in_XMM6_Da = *pfVar1;
    in_XMM6_Db = pfVar1[1];
    in_XMM6_Dc = pfVar1[2];
    in_XMM6_Dd = pfVar1[3];
    in_XMM5 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x20);
    in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar19 + 0x30);
  }
  fVar25 = in_XMM4_Da * fVar29 + (float)local_648._0_4_ * fVar22;
  fVar26 = in_XMM4_Db * fVar29 + (float)local_648._4_4_ * fVar22;
  fVar28 = in_XMM4_Dc * fVar29 + fStack_640 * fVar22;
  fVar34 = in_XMM4_Dd * fVar29 + fStack_63c * fVar22;
  in_XMM14_Da = local_628 * fVar29 + local_638 * fVar22;
  in_XMM14_Db = fStack_624 * fVar29 + fStack_634 * fVar22;
  in_XMM14_Dc = fStack_620 * fVar29 + fStack_630 * fVar22;
  in_XMM14_Dd = fStack_61c * fVar29 + fStack_62c * fVar22;
  in_XMM11_Da = local_558 * fVar29 + in_XMM13_Da * fVar22;
  in_XMM11_Db = fStack_554 * fVar29 + in_XMM13_Db * fVar22;
  in_XMM11_Dc = fStack_550 * fVar29 + in_XMM13_Dc * fVar22;
  in_XMM11_Dd = fStack_54c * fVar29 + auVar38._0_4_ * fVar22;
  local_698._4_4_ = (float)local_698._4_4_ * fVar29 + in_XMM9_Db * fVar22;
  local_698._0_4_ = (float)local_698._0_4_ * fVar29 + in_XMM9_Da * fVar22;
  fStack_690 = fStack_690 * fVar29 + in_XMM9_Dc * fVar22;
  fStack_68c = fStack_68c * fVar29 + in_XMM9_Dd * fVar22;
  auVar38._0_4_ = 1.0 - fVar23;
  in_XMM15_Da = fVar54 * auVar38._0_4_ + fVar40 * fVar23;
  in_XMM15_Db = fVar30 * auVar38._0_4_ + fVar24 * fVar23;
  in_XMM15_Dc = fStack_564 * auVar38._0_4_ + fStack_5d4 * fVar23;
  in_XMM15_Dd = fVar49 * auVar38._0_4_ + fVar61 * fVar23;
  in_XMM10._0_4_ = auVar53._0_4_ * auVar38._0_4_ + in_XMM6_Da * fVar23;
  in_XMM10._4_4_ = auVar53._4_4_ * auVar38._0_4_ + in_XMM6_Db * fVar23;
  in_XMM10._8_4_ = auVar53._8_4_ * auVar38._0_4_ + in_XMM6_Dc * fVar23;
  in_XMM10._12_4_ = auVar53._12_4_ * auVar38._0_4_ + in_XMM6_Dd * fVar23;
  local_658._0_4_ = (float)local_658._0_4_ * auVar38._0_4_ + in_XMM5._0_4_ * fVar23;
  local_658._4_4_ = (float)local_658._4_4_ * auVar38._0_4_ + in_XMM5._4_4_ * fVar23;
  in_XMM0_Dc = fStack_650 * auVar38._0_4_ + in_XMM5._8_4_ * fVar23;
  in_XMM0_Dd = fStack_64c * auVar38._0_4_ + in_XMM5._12_4_ * fVar23;
  local_688._4_4_ = auVar38._0_4_ * fVar37 + fVar23 * in_XMM7._4_4_;
  local_688._0_4_ = auVar38._0_4_ * fVar31 + fVar23 * in_XMM7._0_4_;
  fStack_680 = auVar38._0_4_ * fVar48 + fVar23 * in_XMM7._8_4_;
  fStack_67c = auVar38._0_4_ * fVar58 + fVar23 * in_XMM7._12_4_;
LAB_001cd6c1:
  *(undefined8 *)&(__return_storage_ptr__->upper).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->lower).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = 0;
  fVar24 = in_XMM10._0_4_;
  fVar58 = in_XMM10._4_4_;
  fVar23 = in_XMM10._8_4_;
  fVar29 = in_XMM10._12_4_;
  uVar3 = *(undefined8 *)&(bbox1->lower).field_0;
  uVar8 = *(undefined8 *)((long)&(bbox1->lower).field_0 + 8);
  auVar38._0_4_ = (bbox1->upper).field_0.m128[0];
  fVar22 = (bbox1->upper).field_0.m128[1];
  fVar30 = (bbox1->upper).field_0.m128[2];
  fVar37 = (bbox1->upper).field_0.m128[3];
  uVar9 = *(undefined8 *)&(bbox0->lower).field_0;
  uVar10 = *(undefined8 *)((long)&(bbox0->lower).field_0 + 8);
  fVar48 = (bbox0->upper).field_0.m128[0];
  fVar54 = (bbox0->upper).field_0.m128[1];
  fVar31 = (bbox0->upper).field_0.m128[2];
  fVar49 = (bbox0->upper).field_0.m128[3];
  for (iVar16 = 0; iVar16 != 2; iVar16 = iVar16 + 1) {
    fVar40 = (&obbox0->lower)[iVar16 != 0].field_0.m128[0];
    fVar61 = (&obbox1->lower)[iVar16 != 0].field_0.m128[0];
    for (iVar17 = 0; iVar17 != 2; iVar17 = iVar17 + 1) {
      fVar32 = (&obbox0->lower)[iVar17 != 0].field_0.m128[1];
      fVar35 = (&obbox1->lower)[iVar17 != 0].field_0.m128[1];
      for (iVar18 = 0; iVar18 != 2; iVar18 = iVar18 + 1) {
        fVar36 = (&obbox0->lower)[iVar18 != 0].field_0.m128[2];
        fVar41 = (&obbox1->lower)[iVar18 != 0].field_0.m128[2];
        fVar62 = fVar40 - fVar61;
        fVar65 = fVar32 - fVar35;
        fVar67 = fVar36 - fVar41;
        fVar63 = fVar67 * (in_XMM11_Da - (float)local_658._0_4_) + fVar65 * (in_XMM14_Da - fVar24) +
                 fVar62 * (fVar25 - in_XMM15_Da);
        fVar66 = fVar67 * (in_XMM11_Db - (float)local_658._4_4_) + fVar65 * (in_XMM14_Db - fVar58) +
                 fVar62 * (fVar26 - in_XMM15_Db);
        fVar68 = fVar67 * (in_XMM11_Dc - in_XMM0_Dc) + fVar65 * (in_XMM14_Dc - fVar23) +
                 fVar62 * (fVar28 - in_XMM15_Dc);
        fVar62 = fVar67 * (in_XMM11_Dd - in_XMM0_Dd) + fVar65 * (in_XMM14_Dd - fVar29) +
                 fVar62 * (fVar34 - in_XMM15_Dd);
        denom.field_0.m128[0] = fVar63 + fVar63;
        denom.field_0.m128[1] = fVar66 + fVar66;
        denom.field_0.m128[2] = fVar68 + fVar68;
        denom.field_0.m128[3] = fVar62 + fVar62;
        fVar67 = local_698._0_4_;
        fVar68 = local_698._4_4_;
        fVar43 = local_698._8_4_;
        fVar44 = local_698._12_4_;
        fVar62 = in_XMM11_Da * fVar36 + fVar67 + in_XMM14_Da * fVar32 + fVar25 * fVar40;
        fVar63 = in_XMM11_Db * fVar36 + fVar68 + in_XMM14_Db * fVar32 + fVar26 * fVar40;
        fVar65 = in_XMM11_Dc * fVar36 + fVar43 + in_XMM14_Dc * fVar32 + fVar28 * fVar40;
        fVar66 = in_XMM11_Dd * fVar36 + fVar44 + in_XMM14_Dd * fVar32 + fVar34 * fVar40;
        nom.field_0.m128[0] =
             ((fVar62 + fVar62) -
             (fVar41 * in_XMM11_Da + fVar67 + fVar35 * in_XMM14_Da + fVar61 * fVar25)) -
             (fVar36 * (float)local_658._0_4_ + (float)local_688._0_4_ + fVar32 * fVar24 +
             fVar40 * in_XMM15_Da);
        nom.field_0.m128[1] =
             ((fVar63 + fVar63) -
             (fVar41 * in_XMM11_Db + fVar68 + fVar35 * in_XMM14_Db + fVar61 * fVar26)) -
             (fVar36 * (float)local_658._4_4_ + (float)local_688._4_4_ + fVar32 * fVar58 +
             fVar40 * in_XMM15_Db);
        nom.field_0.m128[2] =
             ((fVar65 + fVar65) -
             (fVar41 * in_XMM11_Dc + fVar43 + fVar35 * in_XMM14_Dc + fVar61 * fVar28)) -
             (fVar36 * in_XMM0_Dc + fStack_680 + fVar32 * fVar23 + fVar40 * in_XMM15_Dc);
        nom.field_0.m128[3] =
             ((fVar66 + fVar66) -
             (fVar41 * in_XMM11_Dd + fVar44 + fVar35 * in_XMM14_Dd + fVar61 * fVar34)) -
             (fVar36 * in_XMM0_Dd + fStack_67c + fVar32 * fVar29 + fVar40 * in_XMM15_Dd);
        for (lVar19 = 0; lVar19 != 0xc; lVar19 = lVar19 + 4) {
          fVar62 = *(float *)((long)&denom.field_0 + lVar19);
          if (fVar62 != 0.0) {
            fVar63 = *(float *)(local_528 + lVar19 + -0x10);
            fVar65 = ((*(float *)((long)&(bbox1->lower).field_0 + lVar19) -
                      *(float *)((long)&(bbox0->lower).field_0 + lVar19)) + fVar63) / fVar62;
            if ((tmin <= fVar65) && (fVar65 <= tmax)) {
              fVar66 = 1.0 - fVar65;
              local_5b8 = (float)uVar3;
              fStack_5b4 = (float)((ulong)uVar3 >> 0x20);
              fStack_5b0 = (float)uVar8;
              fStack_5ac = (float)((ulong)uVar8 >> 0x20);
              local_648._0_4_ = (undefined4)uVar9;
              local_648._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
              fStack_640 = (float)uVar10;
              fStack_63c = (float)((ulong)uVar10 >> 0x20);
              bt.lower.field_0.m128[0] = (float)local_648._0_4_ * fVar66 + local_5b8 * fVar65;
              bt.lower.field_0.m128[1] = (float)local_648._4_4_ * fVar66 + fStack_5b4 * fVar65;
              bt.lower.field_0.m128[2] = fStack_640 * fVar66 + fStack_5b0 * fVar65;
              bt.lower.field_0.m128[3] = fStack_63c * fVar66 + fStack_5ac * fVar65;
              bt.upper.field_0.m128[0] = fVar48 * fVar66 + auVar38._0_4_ * fVar65;
              bt.upper.field_0.m128[1] = fVar54 * fVar66 + fVar22 * fVar65;
              bt.upper.field_0.m128[2] = fVar31 * fVar66 + fVar30 * fVar65;
              bt.upper.field_0.m128[3] = fVar49 * fVar66 + fVar37 * fVar65;
              fVar55 = fVar66 * fVar40 + fVar65 * fVar61;
              fVar56 = fVar66 * fVar32 + fVar65 * fVar35;
              fVar57 = fVar66 * fVar36 + fVar65 * fVar41;
              pt.field_0.m128[1] =
                   fVar57 * (in_XMM11_Db * fVar66 + (float)local_658._4_4_ * fVar65) +
                   fVar68 * fVar66 + (float)local_688._4_4_ * fVar65 +
                   fVar56 * (in_XMM14_Db * fVar66 + fVar58 * fVar65) +
                   fVar55 * (fVar26 * fVar66 + in_XMM15_Db * fVar65);
              pt.field_0.m128[0] =
                   fVar57 * (in_XMM11_Da * fVar66 + (float)local_658._0_4_ * fVar65) +
                   fVar67 * fVar66 + (float)local_688._0_4_ * fVar65 +
                   fVar56 * (in_XMM14_Da * fVar66 + fVar24 * fVar65) +
                   fVar55 * (fVar25 * fVar66 + in_XMM15_Da * fVar65);
              pt.field_0.m128[2] =
                   fVar57 * (in_XMM11_Dc * fVar66 + in_XMM0_Dc * fVar65) +
                   fVar43 * fVar66 + fStack_680 * fVar65 +
                   fVar56 * (in_XMM14_Dc * fVar66 + fVar23 * fVar65) +
                   fVar55 * (fVar28 * fVar66 + in_XMM15_Dc * fVar65);
              pt.field_0.m128[3] =
                   fVar57 * (in_XMM11_Dd * fVar66 + in_XMM0_Dd * fVar65) +
                   fVar44 * fVar66 + fStack_67c * fVar65 +
                   fVar56 * (in_XMM14_Dd * fVar66 + fVar29 * fVar65) +
                   fVar55 * (fVar34 * fVar66 + in_XMM15_Dd * fVar65);
              fVar66 = *(float *)(local_598 + lVar19 + -0x10) -
                       *(float *)((long)&bt.lower.field_0 + lVar19);
              fVar65 = *(float *)((long)&(__return_storage_ptr__->lower).field_0 + lVar19);
              if (fVar65 <= fVar66) {
                fVar66 = fVar65;
              }
              *(float *)((long)&(__return_storage_ptr__->lower).field_0 + lVar19) = fVar66;
            }
            fVar62 = (fVar63 + (*(float *)((long)&(bbox1->upper).field_0 + lVar19) -
                               *(float *)((long)&(bbox0->upper).field_0 + lVar19))) / fVar62;
            if ((tmin <= fVar62) && (fVar62 <= tmax)) {
              fVar63 = 1.0 - fVar62;
              bt.upper.field_0.m128[0] = fVar48 * fVar63 + auVar38._0_4_ * fVar62;
              bt.upper.field_0.m128[1] = fVar54 * fVar63 + fVar22 * fVar62;
              bt.upper.field_0.m128[2] = fVar31 * fVar63 + fVar30 * fVar62;
              bt.upper.field_0.m128[3] = fVar49 * fVar63 + fVar37 * fVar62;
              fVar65 = fVar63 * fVar40 + fVar62 * fVar61;
              fVar66 = fVar63 * fVar32 + fVar62 * fVar35;
              fVar55 = fVar63 * fVar36 + fVar62 * fVar41;
              pt.field_0.m128[1] =
                   fVar55 * (in_XMM11_Db * fVar63 + (float)local_658._4_4_ * fVar62) +
                   fVar68 * fVar63 + (float)local_688._4_4_ * fVar62 +
                   fVar66 * (in_XMM14_Db * fVar63 + fVar58 * fVar62) +
                   fVar65 * (fVar26 * fVar63 + in_XMM15_Db * fVar62);
              pt.field_0.m128[0] =
                   fVar55 * (in_XMM11_Da * fVar63 + (float)local_658._0_4_ * fVar62) +
                   fVar67 * fVar63 + (float)local_688._0_4_ * fVar62 +
                   fVar66 * (in_XMM14_Da * fVar63 + fVar24 * fVar62) +
                   fVar65 * (fVar25 * fVar63 + in_XMM15_Da * fVar62);
              pt.field_0.m128[2] =
                   fVar55 * (in_XMM11_Dc * fVar63 + in_XMM0_Dc * fVar62) +
                   fVar43 * fVar63 + fStack_680 * fVar62 +
                   fVar66 * (in_XMM14_Dc * fVar63 + fVar23 * fVar62) +
                   fVar65 * (fVar28 * fVar63 + in_XMM15_Dc * fVar62);
              pt.field_0.m128[3] =
                   fVar55 * (in_XMM11_Dd * fVar63 + in_XMM0_Dd * fVar62) +
                   fVar44 * fVar63 + fStack_67c * fVar62 +
                   fVar66 * (in_XMM14_Dd * fVar63 + fVar29 * fVar62) +
                   fVar65 * (fVar34 * fVar63 + in_XMM15_Dd * fVar62);
              fVar63 = *(float *)(local_598 + lVar19 + -0x10) -
                       *(float *)((long)&bt.upper.field_0 + lVar19);
              fVar62 = *(float *)((long)&(__return_storage_ptr__->upper).field_0 + lVar19);
              if (fVar63 <= fVar62) {
                fVar63 = fVar62;
              }
              *(float *)((long)&(__return_storage_ptr__->upper).field_0 + lVar19) = fVar63;
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa InstanceArray::boundSegment(size_t i, size_t itime,
      BBox3fa const& obbox0, BBox3fa const& obbox1,
      BBox3fa const& bbox0, BBox3fa const& bbox1,
      float tmin, float tmax) const
  {
    if (unlikely(gsubtype == GTY_SUBTYPE_INSTANCE_QUATERNION)) {
      auto const& xfm0 = l2w(i, itime);
      auto const& xfm1 = l2w(i, itime+1);
      MotionDerivativeCoefficients motionDerivCoeffs(xfm0, xfm1);
      return boundSegmentNonlinear(motionDerivCoeffs, xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    } else {
      auto const& xfm0 = getLocal2World(i, itime);
      auto const& xfm1 = getLocal2World(i, itime+1);
      return boundSegmentLinear(xfm0, xfm1, obbox0, obbox1, bbox0, bbox1, tmin, tmax);
    }
  }